

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheFunction.hpp
# Opt level: O1

uint32_t __thiscall
CacheFunction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/tests/CacheFunctionTest.cpp:26:12),_std::function<double_(double)>_>
::inspect(CacheFunction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_libKriging[P]libKriging_tests_CacheFunctionTest_cpp:26:12),_std::function<double_(double)>_>
          *this,double args)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  uint32_t uVar3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  hash<double> local_9;
  
  p_Var4 = (_Hash_node_base *)Catch::clara::std::hash<double>::operator()(&local_9,args);
  uVar1 = (this->super_CacheFunctionCommon).m_cache_hit._M_h._M_bucket_count;
  uVar5 = (ulong)p_Var4 % uVar1;
  p_Var6 = (this->super_CacheFunctionCommon).m_cache_hit._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, p_Var4 != p_Var6->_M_nxt[1]._M_nxt)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, p_Var4 == p_Var2[1]._M_nxt)) goto LAB_0013a497;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_0013a497:
  uVar3 = 0;
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var7->_M_nxt;
  }
  if (p_Var4 != (_Hash_node_base *)0x0) {
    uVar3 = *(uint32_t *)&p_Var4[2]._M_nxt;
  }
  return uVar3;
}

Assistant:

auto inspect(Args... args) -> uint32_t {
    const auto arg_key = hash_args(args...);
    const auto finder = m_cache_hit.find(arg_key);
    return (finder == m_cache_hit.end()) ? 0 : finder->second;
  }